

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

void TryChopUpUncompressedBigTiff(TIFF *tif)

{
  undefined1 auVar1 [16];
  uint rowsperstrip_00;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  toff_t tVar7;
  uint local_84;
  uint64_t last_bytecount;
  uint64_t filesize;
  uint64_t last_offset;
  uint32_t nstrips;
  uint64_t stripbytes;
  uint32_t rowsperstrip;
  uint32_t rowblocksperstrip;
  uint64_t stripsize;
  uint32_t i;
  uint64_t rowblockbytes;
  uint32_t rowblock;
  TIFFDirectory *td;
  TIFF *tif_local;
  
  uVar2 = TIFFStripSize64(tif);
  if ((tif->tif_dir).td_planarconfig != 1) {
    __assert_fail("tif->tif_dir.td_planarconfig == PLANARCONFIG_CONTIG",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1cec,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  if ((tif->tif_dir).td_compression != 1) {
    __assert_fail("tif->tif_dir.td_compression == COMPRESSION_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1ced,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  if ((tif->tif_flags & 0x8400) != 0x8000) {
    __assert_fail("(tif->tif_flags & (TIFF_STRIPCHOP | TIFF_ISTILED)) == TIFF_STRIPCHOP",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                  ,0x1cef,"void TryChopUpUncompressedBigTiff(TIFF *)");
  }
  if (0x7fffffff < uVar2) {
    uVar3 = TIFFGetStrileByteCount(tif,0);
    if ((uVar3 != 0) || (tif->tif_mode == 0)) {
      if (((tif->tif_dir).td_photometric == 6) && ((tif->tif_flags & 0x4000) == 0)) {
        rowblockbytes._4_4_ = (uint)(tif->tif_dir).td_ycbcrsubsampling[1];
      }
      else {
        rowblockbytes._4_4_ = 1;
      }
      uVar3 = TIFFVStripSize64(tif,rowblockbytes._4_4_);
      if ((uVar3 != 0) && (uVar3 < 0x80000000)) {
        for (stripsize._4_4_ = 0; stripsize._4_4_ < (tif->tif_dir).td_nstrips;
            stripsize._4_4_ = stripsize._4_4_ + 1) {
          if (stripsize._4_4_ == (tif->tif_dir).td_nstrips - 1) {
            uVar4 = TIFFGetStrileByteCount(tif,stripsize._4_4_);
            uVar5 = TIFFVStripSize64(tif,(tif->tif_dir).td_imagelength -
                                         stripsize._4_4_ * (tif->tif_dir).td_rowsperstrip);
            if (uVar4 < uVar5) {
              return;
            }
          }
          else {
            uVar4 = TIFFGetStrileByteCount(tif,stripsize._4_4_);
            if (uVar4 != uVar2) {
              return;
            }
            if (stripsize._4_4_ != 0) {
              uVar4 = TIFFGetStrileOffset(tif,stripsize._4_4_);
              uVar5 = TIFFGetStrileOffset(tif,stripsize._4_4_ - 1);
              uVar6 = TIFFGetStrileByteCount(tif,stripsize._4_4_ - 1);
              if (uVar4 != uVar5 + uVar6) {
                return;
              }
            }
          }
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        stripbytes._4_4_ = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x20000000)) / auVar1,0);
        if (stripbytes._4_4_ == 0) {
          stripbytes._4_4_ = 1;
        }
        rowsperstrip_00 = stripbytes._4_4_ * rowblockbytes._4_4_;
        if (0x7fffffff < stripbytes._4_4_ * uVar3) {
          __assert_fail("stripbytes <= 0x7FFFFFFFUL",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                        ,0x1d24,"void TryChopUpUncompressedBigTiff(TIFF *)");
        }
        if ((tif->tif_dir).td_imagelength < -(rowsperstrip_00 - 1) - 1) {
          local_84 = ((tif->tif_dir).td_imagelength + (rowsperstrip_00 - 1)) / rowsperstrip_00;
        }
        else {
          local_84 = 0;
        }
        if (local_84 != 0) {
          if ((tif->tif_mode == 0) && (1000000 < local_84)) {
            uVar2 = TIFFGetStrileOffset(tif,(tif->tif_dir).td_nstrips - 1);
            tVar7 = (*tif->tif_sizeproc)(tif->tif_clientdata);
            uVar4 = TIFFGetStrileByteCount(tif,(tif->tif_dir).td_nstrips - 1);
            if (tVar7 < uVar2) {
              return;
            }
            if (tVar7 - uVar2 < uVar4) {
              return;
            }
          }
          allocChoppedUpStripArrays(tif,local_84,stripbytes._4_4_ * uVar3,rowsperstrip_00);
        }
      }
    }
    return;
  }
  __assert_fail("stripsize > 0x7FFFFFFFUL",
                "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                ,0x1cf0,"void TryChopUpUncompressedBigTiff(TIFF *)");
}

Assistant:

static void TryChopUpUncompressedBigTiff(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t rowblock;
    uint64_t rowblockbytes;
    uint32_t i;
    uint64_t stripsize;
    uint32_t rowblocksperstrip;
    uint32_t rowsperstrip;
    uint64_t stripbytes;
    uint32_t nstrips;

    stripsize = TIFFStripSize64(tif);

    assert(tif->tif_dir.td_planarconfig == PLANARCONFIG_CONTIG);
    assert(tif->tif_dir.td_compression == COMPRESSION_NONE);
    assert((tif->tif_flags & (TIFF_STRIPCHOP | TIFF_ISTILED)) ==
           TIFF_STRIPCHOP);
    assert(stripsize > 0x7FFFFFFFUL);

    /* On a newly created file, just re-opened to be filled, we */
    /* don't want strip chop to trigger as it is going to cause issues */
    /* later ( StripOffsets and StripByteCounts improperly filled) . */
    if (TIFFGetStrileByteCount(tif, 0) == 0 && tif->tif_mode != O_RDONLY)
        return;

    if ((td->td_photometric == PHOTOMETRIC_YCBCR) && (!isUpSampled(tif)))
        rowblock = td->td_ycbcrsubsampling[1];
    else
        rowblock = 1;
    rowblockbytes = TIFFVStripSize64(tif, rowblock);
    if (rowblockbytes == 0 || rowblockbytes > 0x7FFFFFFFUL)
    {
        /* In case of file with gigantic width */
        return;
    }

    /* Check that the strips are contiguous and of the expected size */
    for (i = 0; i < td->td_nstrips; i++)
    {
        if (i == td->td_nstrips - 1)
        {
            if (TIFFGetStrileByteCount(tif, i) <
                TIFFVStripSize64(tif,
                                 td->td_imagelength - i * td->td_rowsperstrip))
            {
                return;
            }
        }
        else
        {
            if (TIFFGetStrileByteCount(tif, i) != stripsize)
            {
                return;
            }
            if (i > 0 && TIFFGetStrileOffset(tif, i) !=
                             TIFFGetStrileOffset(tif, i - 1) +
                                 TIFFGetStrileByteCount(tif, i - 1))
            {
                return;
            }
        }
    }

    /* Aim for 512 MB strips (that will still be manageable by 32 bit builds */
    rowblocksperstrip = (uint32_t)(512 * 1024 * 1024 / rowblockbytes);
    if (rowblocksperstrip == 0)
        rowblocksperstrip = 1;
    rowsperstrip = rowblocksperstrip * rowblock;
    stripbytes = rowblocksperstrip * rowblockbytes;
    assert(stripbytes <= 0x7FFFFFFFUL);

    nstrips = TIFFhowmany_32(td->td_imagelength, rowsperstrip);
    if (nstrips == 0)
        return;

    /* If we are going to allocate a lot of memory, make sure that the */
    /* file is as big as needed */
    if (tif->tif_mode == O_RDONLY && nstrips > 1000000)
    {
        uint64_t last_offset = TIFFGetStrileOffset(tif, td->td_nstrips - 1);
        uint64_t filesize = TIFFGetFileSize(tif);
        uint64_t last_bytecount =
            TIFFGetStrileByteCount(tif, td->td_nstrips - 1);
        if (last_offset > filesize || last_bytecount > filesize - last_offset)
        {
            return;
        }
    }

    allocChoppedUpStripArrays(tif, nstrips, stripbytes, rowsperstrip);
}